

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  SimpleTag *pSVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  
  iVar3 = this->m_simple_tags_size;
  uVar4 = this->m_simple_tags_count;
  if ((int)uVar4 < iVar3) {
    return true;
  }
  iVar9 = 1;
  if (iVar3 != 0) {
    iVar9 = iVar3 * 2;
  }
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar9) {
    uVar10 = (long)iVar9 << 4 | 8;
  }
  plVar7 = (long *)operator_new__(uVar10,(nothrow_t *)&std::nothrow);
  if (plVar7 == (long *)0x0) {
    return false;
  }
  *plVar7 = (long)iVar9;
  pSVar5 = this->m_simple_tags;
  if ((int)uVar4 < 1) {
    if (pSVar5 == (SimpleTag *)0x0) goto LAB_00115590;
  }
  else {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pSVar5->m_tag_name + lVar8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&((SimpleTag *)(plVar7 + 1))->m_tag_name + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar8);
  }
  operator_delete__(&pSVar5[-1].m_tag_string);
LAB_00115590:
  this->m_simple_tags = (SimpleTag *)(plVar7 + 1);
  this->m_simple_tags_size = iVar9;
  return true;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}